

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::BinaryExpr<char_data_*const_&,_char_data_*const_&>::streamReconstructedExpression
          (BinaryExpr<char_data_*const_&,_char_data_*const_&> *this,ostream *os)

{
  StringRef SVar1;
  char_data *in_stack_ffffffffffffff98;
  long *local_60 [2];
  long local_50 [2];
  long *local_40 [2];
  long local_30 [2];
  
  StringMaker<char_data_*,_void>::convert<char_data>(in_stack_ffffffffffffff98);
  SVar1 = this->m_op;
  StringMaker<char_data_*,_void>::convert<char_data>(in_stack_ffffffffffffff98);
  Catch::formatReconstructedExpression(os,(string *)local_40,SVar1,(string *)local_60);
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }